

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_api.c
# Opt level: O0

void * lua_newuserdata(lua_State *L,size_t size)

{
  TValue *pTVar1;
  GCtab *env;
  GCudata *pGVar2;
  GCudata *ud;
  size_t size_local;
  lua_State *L_local;
  
  if (*(ulong *)((L->glref).ptr64 + 0x18) <= *(ulong *)((L->glref).ptr64 + 0x10)) {
    lj_gc_step(L);
  }
  if (0x7fffff00 < size) {
    lj_err_msg(L,LJ_ERR_UDATAOV);
  }
  env = getcurrenv(L);
  pGVar2 = lj_udata_new(L,(MSize)size,env);
  L->top->u64 = (ulong)pGVar2 | 0xfff9800000000000;
  pTVar1 = L->top;
  L->top = pTVar1 + 1;
  if ((TValue *)(L->maxstack).ptr64 <= pTVar1 + 1) {
    lj_state_growstack1(L);
  }
  return pGVar2 + 1;
}

Assistant:

LUA_API void *lua_newuserdata(lua_State *L, size_t size)
{
  GCudata *ud;
  lj_gc_check(L);
  if (size > LJ_MAX_UDATA)
    lj_err_msg(L, LJ_ERR_UDATAOV);
  ud = lj_udata_new(L, (MSize)size, getcurrenv(L));
  setudataV(L, L->top, ud);
  incr_top(L);
  return uddata(ud);
}